

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall rlottie::internal::renderer::Clipper::update(Clipper *this,VMatrix *matrix)

{
  VPath *this_00;
  VRectF local_28;
  
  this_00 = &this->mPath;
  VPath::reset(this_00);
  local_28.x1 = 0.0;
  local_28.y1 = 0.0;
  local_28.x2 = (float)(this->mSize).mw;
  local_28.y2 = (float)(this->mSize).mh;
  VPath::addRect(this_00,&local_28,CW);
  VPath::transform(this_00,matrix);
  this->mRasterRequest = true;
  return;
}

Assistant:

void renderer::Clipper::update(const VMatrix &matrix)
{
    mPath.reset();
    mPath.addRect(VRectF(0, 0, mSize.width(), mSize.height()));
    mPath.transform(matrix);
    mRasterRequest = true;
}